

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_ntlm.c
# Opt level: O3

CURLcode Curl_input_ntlm(connectdata *conn,_Bool proxy,char *header)

{
  curlntlm cVar1;
  int iVar2;
  CURLcode CVar3;
  ushort **ppuVar4;
  ntlmdata *ntlm;
  byte bVar5;
  undefined7 in_register_00000031;
  char *type2msg;
  
  iVar2 = Curl_raw_nequal("NTLM",header,4);
  if (iVar2 == 0) {
    return CURLE_OK;
  }
  ntlm = (ntlmdata *)
         ((conn->ntlm).nonce + ((ulong)(uint)((int)CONCAT71(in_register_00000031,proxy) << 5) - 8));
  bVar5 = header[4];
  if (bVar5 != 0) {
    type2msg = header + 4;
    ppuVar4 = __ctype_b_loc();
    do {
      if ((*(byte *)((long)*ppuVar4 + (ulong)bVar5 * 2 + 1) & 0x20) == 0) {
        CVar3 = Curl_auth_decode_ntlm_type2_message(conn->data,type2msg,ntlm);
        if (CVar3 != CURLE_OK) {
          return CVar3;
        }
        ntlm->state = NTLMSTATE_TYPE2;
        goto LAB_001413b0;
      }
      bVar5 = type2msg[1];
      type2msg = type2msg + 1;
    } while (bVar5 != 0);
  }
  cVar1 = ntlm->state;
  if (cVar1 == NTLMSTATE_NONE) {
LAB_00141390:
    ntlm->state = NTLMSTATE_TYPE1;
LAB_001413b0:
    CVar3 = CURLE_OK;
  }
  else {
    if (cVar1 == NTLMSTATE_TYPE3) {
      Curl_infof(conn->data,"NTLM handshake rejected\n");
      Curl_auth_ntlm_cleanup(&conn->ntlm);
      Curl_auth_ntlm_cleanup(&conn->proxyntlm);
      ntlm->state = NTLMSTATE_NONE;
    }
    else {
      if (cVar1 == NTLMSTATE_LAST) {
        Curl_infof(conn->data,"NTLM auth restarted\n");
        Curl_auth_ntlm_cleanup(&conn->ntlm);
        Curl_auth_ntlm_cleanup(&conn->proxyntlm);
        goto LAB_00141390;
      }
      Curl_infof(conn->data,"NTLM handshake failure (internal error)\n");
    }
    CVar3 = CURLE_REMOTE_ACCESS_DENIED;
  }
  return CVar3;
}

Assistant:

CURLcode Curl_input_ntlm(struct connectdata *conn,
                         bool proxy,         /* if proxy or not */
                         const char *header) /* rest of the www-authenticate:
                                                header */
{
  /* point to the correct struct with this */
  struct ntlmdata *ntlm;
  CURLcode result = CURLE_OK;

  ntlm = proxy ? &conn->proxyntlm : &conn->ntlm;

  if(checkprefix("NTLM", header)) {
    header += strlen("NTLM");

    while(*header && ISSPACE(*header))
      header++;

    if(*header) {
      result = Curl_auth_decode_ntlm_type2_message(conn->data, header, ntlm);
      if(result)
        return result;

      ntlm->state = NTLMSTATE_TYPE2; /* We got a type-2 message */
    }
    else {
      if(ntlm->state == NTLMSTATE_LAST) {
        infof(conn->data, "NTLM auth restarted\n");
        Curl_http_ntlm_cleanup(conn);
      }
      else if(ntlm->state == NTLMSTATE_TYPE3) {
        infof(conn->data, "NTLM handshake rejected\n");
        Curl_http_ntlm_cleanup(conn);
        ntlm->state = NTLMSTATE_NONE;
        return CURLE_REMOTE_ACCESS_DENIED;
      }
      else if(ntlm->state >= NTLMSTATE_TYPE1) {
        infof(conn->data, "NTLM handshake failure (internal error)\n");
        return CURLE_REMOTE_ACCESS_DENIED;
      }

      ntlm->state = NTLMSTATE_TYPE1; /* We should send away a type-1 */
    }
  }

  return result;
}